

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O2

void __thiscall
duckdb::InternalApproxTopKState::IncrementCount
          (InternalApproxTopKState *this,ApproxTopKValue *value,idx_t increment)

{
  idx_t iVar1;
  pointer prVar2;
  ApproxTopKValue *pAVar3;
  ApproxTopKValue *pAVar4;
  idx_t iVar5;
  
  value->count = value->count + increment;
  while( true ) {
    iVar1 = value->index;
    if (iVar1 == 0) {
      return;
    }
    prVar2 = (this->values).
             super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar3 = prVar2[iVar1 - 1]._M_data;
    pAVar4 = prVar2[iVar1]._M_data;
    if (pAVar4->count <= pAVar3->count) break;
    iVar5 = pAVar4->index;
    pAVar4->index = pAVar3->index;
    pAVar3->index = iVar5;
    pAVar3 = prVar2[iVar1]._M_data;
    prVar2[iVar1]._M_data = prVar2[iVar1 - 1]._M_data;
    prVar2[iVar1 - 1]._M_data = pAVar3;
  }
  return;
}

Assistant:

void IncrementCount(ApproxTopKValue &value, idx_t increment = 1) {
		value.count += increment;
		// maintain sortedness of "values"
		// swap while we have a higher count than the next entry
		while (value.index > 0 && values[value.index].get().count > values[value.index - 1].get().count) {
			// swap the elements around
			auto &left = values[value.index];
			auto &right = values[value.index - 1];
			std::swap(left.get().index, right.get().index);
			std::swap(left, right);
		}
	}